

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytobin.cpp
# Opt level: O0

void __thiscall VulnerabilityToBin::WriteIdxVulnerabilityFile(VulnerabilityToBin *this)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  size_type local_40;
  unsigned_long zippedVulnerabilityRowsLength;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> zvr;
  VulnerabilityToBin *this_local;
  
  (this->vIdx_).vulnerability_id = (this->super_ValidateVulnerability).prevVulID_;
  (this->vIdx_).size = (long)this->rowCount_ * 0xc;
  zvr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if ((this->zip_ & 1U) != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
    sVar1 = std::vector<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>::size
                      (&this->vulnerabilityRows_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,sVar1 * 0xc + 0x400
              );
    local_40 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0);
    pvVar3 = std::vector<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>::operator[]
                       (&this->vulnerabilityRows_,0);
    sVar1 = std::vector<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>::size
                      (&this->vulnerabilityRows_);
    compress(pvVar2,&local_40,pvVar3,sVar1 * 0xc);
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0);
    fwrite(pvVar2,local_40,1,(FILE *)this->fileOutBin_);
    (this->vIdx_).size = local_40;
    (this->vIdx_).original_size = (long)this->rowCount_ * 0xc;
    std::vector<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>::clear
              (&this->vulnerabilityRows_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  }
  fwrite(&this->vIdx_,0x1c,1,(FILE *)this->fileOutIdx_);
  (this->vIdx_).offset = (this->vIdx_).size + (this->vIdx_).offset;
  this->rowCount_ = 0;
  return;
}

Assistant:

void VulnerabilityToBin::WriteIdxVulnerabilityFile() {

  vIdx_.vulnerability_id = prevVulID_;
  vIdx_.size = rowCount_ * sizeof(VulnerabilityRow);

  if (zip_) {

    std::vector<unsigned char> zvr;
    zvr.resize(vulnerabilityRows_.size() * sizeof(VulnerabilityRow) + 1024);
    unsigned long zippedVulnerabilityRowsLength = zvr.size();
    compress(&zvr[0], &zippedVulnerabilityRowsLength,
	     (unsigned char*)&vulnerabilityRows_[0],
	     vulnerabilityRows_.size() * sizeof(VulnerabilityRow));
    fwrite((unsigned char*)&zvr[0], zippedVulnerabilityRowsLength, 1,
	   fileOutBin_);

    // Overwrite with actual size of compressed buffer
    vIdx_.size = zippedVulnerabilityRowsLength;

    vIdx_.original_size = rowCount_ * sizeof(VulnerabilityRow);

    vulnerabilityRows_.clear();   // Reset

  }

  fwrite(&vIdx_, sizeof(vIdx_), 1, fileOutIdx_);

  // Set new offset and reset row counter
  vIdx_.offset += vIdx_.size;
  rowCount_ = 0;

}